

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O2

void __thiscall
slang::ast::StreamingConcatenationExpression::serializeTo
          (StreamingConcatenationExpression *this,ASTSerializer *serializer)

{
  Expression *__n;
  long lVar1;
  StreamExpression *stream;
  pointer this_00;
  string_view name;
  
  ASTSerializer::write(serializer,9,"sliceSize",this->sliceSize);
  if ((this->streams_).size_ != 0) {
    name._M_str = "streams";
    name._M_len = 7;
    ASTSerializer::startArray(serializer,name);
    this_00 = (this->streams_).data_;
    for (lVar1 = (this->streams_).size_ * 0x18; lVar1 != 0; lVar1 = lVar1 + -0x18) {
      ASTSerializer::startObject(serializer);
      __n = not_null<const_slang::ast::Expression_*>::get(&this_00->operand);
      ASTSerializer::write(serializer,7,"operand",(size_t)__n);
      if (this_00->withExpr != (Expression *)0x0) {
        ASTSerializer::write(serializer,8,"withExpr",(size_t)this_00->withExpr);
      }
      ASTSerializer::endObject(serializer);
      this_00 = this_00 + 1;
    }
    ASTSerializer::endArray(serializer);
    return;
  }
  return;
}

Assistant:

void StreamingConcatenationExpression::serializeTo(ASTSerializer& serializer) const {
    serializer.write("sliceSize", sliceSize);
    if (!streams().empty()) {
        serializer.startArray("streams");
        for (auto& stream : streams()) {
            serializer.startObject();
            serializer.write("operand", *stream.operand);
            if (stream.withExpr)
                serializer.write("withExpr", *stream.withExpr);
            serializer.endObject();
        }
        serializer.endArray();
    }
}